

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmpp_obj.c
# Opt level: O0

rk_s32 kmpp_obj_udump_f(KmppObj obj,char *caller)

{
  int iVar1;
  char *pcVar2;
  void *val_00;
  void *val_01;
  uint uVar3;
  ulong uVar4;
  anon_union_8_2_e6ce6506_for_KmppShmPtr_t_2 aVar5;
  anon_union_8_2_e6ce6506_for_KmppShmPtr_t_2 aVar6;
  rk_u64 in_stack_fffffffffffffe40;
  MppTrie local_188;
  void *local_180;
  void *val_chk_7;
  void *val_7;
  void *val_chk_6;
  void *val_6;
  KmppShmPtr *val_5;
  KmppShmPtr *val_chk_5;
  rk_s32 j;
  rk_s32 pos;
  char logs [128];
  rk_s32 data_size;
  void *val_4;
  void *val_chk_4;
  rk_u64 val_chk_3;
  rk_u64 val_3;
  rk_s64 val_chk_2;
  rk_s64 val_2;
  rk_u32 local_88;
  rk_u32 val_chk_1;
  rk_u32 val_1;
  rk_s32 val_chk;
  rk_s32 val;
  rk_s32 idx;
  KmppEntry *e;
  RK_S32 i;
  rk_s32 ret;
  char *name;
  MppTrieInfo *next;
  MppTrieInfo *info;
  MppTrie trie;
  KmppObjDefImpl *def;
  KmppObjImpl *impl;
  char *caller_local;
  KmppObj obj_local;
  
  if (obj == (KmppObj)0x0) {
    local_188 = (MppTrie)0x0;
  }
  else {
    local_188 = *(MppTrie *)((long)obj + 8);
  }
  trie = local_188;
  info = (MppTrieInfo *)0x0;
  next = (MppTrieInfo *)0x0;
  name = (char *)0x0;
  _i = (char *)0x0;
  e._4_4_ = -1;
  e._0_4_ = 0;
  def = (KmppObjDefImpl *)obj;
  impl = (KmppObjImpl *)caller;
  caller_local = (char *)obj;
  if ((obj == (KmppObj)0x0) || (local_188 == (MppTrie)0x0)) {
    _mpp_log_l(2,"kmpp_obj","invalid obj %p def %p\n","kmpp_obj_udump_f",obj,local_188);
    obj_local._4_4_ = -1;
  }
  else {
    info = *(MppTrieInfo **)((long)obj + 0x10);
    _i = *(char **)((long)local_188 + 0x18);
    _mpp_log_l(4,"kmpp_obj","dump obj %-12s - %p at %s:\n",(char *)0x0,_i,obj,caller);
    name = (char *)mpp_trie_get_info_first(info);
    while (name != (char *)0x0) {
      next = (MppTrieInfo *)name;
      name = (char *)mpp_trie_get_info_next(info,(MppTrieInfo *)name);
      _val = (KmppEntry *)mpp_trie_info_ctx(next);
      _i = mpp_trie_info_name(next);
      pcVar2 = strstr(_i,"__");
      if (pcVar2 == (char *)0x0) {
        uVar3 = (uint)e + 1;
        val_chk = (uint)e;
        switch(*(undefined1 *)((long)_val + 1)) {
        case 0:
          e._0_4_ = uVar3;
          e._4_4_ = kmpp_obj_tbl_get_s32(caller_local,_val,(rk_s32 *)&val_1);
          if (e._4_4_ == 0) {
            caller._4_4_ = (undefined4)((ulong)caller >> 0x20);
            caller._0_4_ = val_1;
            in_stack_fffffffffffffe40 = CONCAT44((int)(in_stack_fffffffffffffe40 >> 0x20),val_1);
            _mpp_log_l(4,"kmpp_obj","%-2d - %-16s s32 %#x:%d\n",(char *)0x0,(ulong)(uint)val_chk,_i,
                       caller,in_stack_fffffffffffffe40);
          }
          else {
            _mpp_log_l(2,"kmpp_obj","%-2d - %-16s s32 get failed\n",(char *)0x0,(ulong)(uint)val_chk
                       ,_i);
          }
          kmpp_obj_get_s32(caller_local,_i,(rk_s32 *)&val_chk_1);
          if (val_1 != val_chk_1) {
            _mpp_log_l(2,"kmpp_obj","%-2d - %-16s s32 check failed\n",(char *)0x0,
                       (ulong)(uint)val_chk,_i,caller);
          }
          break;
        case 1:
          e._0_4_ = uVar3;
          e._4_4_ = kmpp_obj_tbl_get_u32(caller_local,_val,&local_88);
          if (e._4_4_ == 0) {
            caller._4_4_ = (undefined4)((ulong)caller >> 0x20);
            caller._0_4_ = local_88;
            in_stack_fffffffffffffe40 = CONCAT44((int)(in_stack_fffffffffffffe40 >> 0x20),local_88);
            _mpp_log_l(4,"kmpp_obj","%-2d - %-16s u32 %#x:%u\n",(char *)0x0,(ulong)(uint)val_chk,_i,
                       caller,in_stack_fffffffffffffe40);
          }
          else {
            _mpp_log_l(2,"kmpp_obj","%-2d - %-16s u32 get failed\n",(char *)0x0,(ulong)(uint)val_chk
                       ,_i);
          }
          kmpp_obj_get_u32(caller_local,_i,(rk_u32 *)((long)&val_2 + 4));
          if (local_88 != val_2._4_4_) {
            _mpp_log_l(2,"kmpp_obj","%-2d - %-16s u32 check failed\n",(char *)0x0,
                       (ulong)(uint)val_chk,_i,caller);
          }
          break;
        case 2:
          e._0_4_ = uVar3;
          e._4_4_ = kmpp_obj_tbl_get_s64(caller_local,_val,&val_chk_2);
          if (e._4_4_ == 0) {
            caller = (char *)val_chk_2;
            in_stack_fffffffffffffe40 = val_chk_2;
            _mpp_log_l(4,"kmpp_obj","%-2d - %-16s s64 %#llx:%lld\n",(char *)0x0,(ulong)(uint)val_chk
                       ,_i,val_chk_2,val_chk_2);
          }
          else {
            _mpp_log_l(2,"kmpp_obj","%-2d - %-16s s64 get failed\n",(char *)0x0,(ulong)(uint)val_chk
                       ,_i);
          }
          kmpp_obj_get_s64(caller_local,_i,(rk_s64 *)&val_3);
          if (val_chk_2 != val_3) {
            _mpp_log_l(2,"kmpp_obj","%-2d - %-16s s64 check failed\n",(char *)0x0,
                       (ulong)(uint)val_chk,_i,caller);
          }
          break;
        case 3:
          e._0_4_ = uVar3;
          e._4_4_ = kmpp_obj_tbl_get_u64(caller_local,_val,&val_chk_3);
          if (e._4_4_ == 0) {
            caller = (char *)val_chk_3;
            in_stack_fffffffffffffe40 = val_chk_3;
            _mpp_log_l(4,"kmpp_obj","%-2d - %-16s u64 %#llx:%llu\n",(char *)0x0,(ulong)(uint)val_chk
                       ,_i,val_chk_3,val_chk_3);
          }
          else {
            _mpp_log_l(2,"kmpp_obj","%-2d - %-16s u64 get failed\n",(char *)0x0,(ulong)(uint)val_chk
                       ,_i);
          }
          kmpp_obj_get_u64(caller_local,_i,(rk_u64 *)&val_chk_4);
          if ((void *)val_chk_3 != val_chk_4) {
            _mpp_log_l(2,"kmpp_obj","%-2d - %-16s u64 check failed\n",(char *)0x0,
                       (ulong)(uint)val_chk,_i,caller);
          }
          break;
        default:
          uVar4 = (ulong)(uint)e;
          aVar6.kaddr._2_2_ = 0;
          aVar6.kaddr._0_2_ = *(ushort *)_val >> 8;
          aVar6._4_4_ = (undefined4)((ulong)caller >> 0x20);
          e._0_4_ = uVar3;
          _mpp_log_l(2,"kmpp_obj","%-2d - %-16s found invalid type %d\n",(char *)0x0,uVar4,_i,
                     aVar6.kaddr);
          e._4_4_ = -1;
          caller = (char *)aVar6;
          break;
        case 5:
          e._0_4_ = uVar3;
          val_00 = mpp_osal_malloc("kmpp_obj_udump_f",(ulong)*(ushort *)((long)_val + 2));
          val_01 = mpp_osal_malloc("kmpp_obj_udump_f",(ulong)*(ushort *)((long)_val + 2));
          logs._124_4_ = ZEXT24(*(ushort *)((long)_val + 2));
          e._4_4_ = kmpp_obj_tbl_get_st(caller_local,_val,val_01);
          if (e._4_4_ == 0) {
            aVar5.kaddr._2_2_ = 0;
            aVar5.kaddr._0_2_ = *(ushort *)((long)_val + 4);
            aVar5._4_4_ = (undefined4)((ulong)caller >> 0x20);
            in_stack_fffffffffffffe40 =
                 CONCAT44((int)(in_stack_fffffffffffffe40 >> 0x20),logs._124_4_);
            _mpp_log_l(4,"kmpp_obj","%-2d - %-16s st  %d:%d\n",(char *)0x0,(ulong)(uint)val_chk,_i,
                       aVar5.kaddr,in_stack_fffffffffffffe40);
            caller = (char *)aVar5;
            for (val_chk_5._0_4_ = 0; (int)(uint)val_chk_5 < (int)logs._124_4_ / 4 + -8;
                val_chk_5._0_4_ = (uint)val_chk_5 + 8) {
              caller._4_4_ = (undefined4)((ulong)caller >> 0x20);
              caller._0_4_ = *(undefined4 *)((long)val_01 + (long)(int)((uint)val_chk_5 + 2) * 4);
              in_stack_fffffffffffffe40 =
                   CONCAT44((int)(in_stack_fffffffffffffe40 >> 0x20),
                            *(undefined4 *)((long)val_01 + (long)(int)((uint)val_chk_5 + 3) * 4));
              snprintf((char *)&j,0x7f,"   - %02x : %#08x %#08x %#08x %#08x %#08x %#08x %#08x %#08x"
                       ,(ulong)(uint)val_chk_5,
                       (ulong)*(uint *)((long)val_01 + (long)(int)(uint)val_chk_5 * 4),
                       (ulong)*(uint *)((long)val_01 + (long)(int)((uint)val_chk_5 + 1) * 4),caller,
                       in_stack_fffffffffffffe40,
                       *(undefined4 *)((long)val_01 + (long)(int)((uint)val_chk_5 + 4) * 4),
                       *(undefined4 *)((long)val_01 + (long)(int)((uint)val_chk_5 + 5) * 4),
                       *(undefined4 *)((long)val_01 + (long)(int)((uint)val_chk_5 + 6) * 4),
                       *(undefined4 *)((long)val_01 + (long)(int)((uint)val_chk_5 + 7) * 4));
              _mpp_log_l(4,"kmpp_obj","%s\n",(char *)0x0,&j);
            }
            val_chk_5._4_4_ = snprintf((char *)&j,0x7f,"   - %02x :",(ulong)(uint)val_chk_5);
            for (; (int)(uint)val_chk_5 < (int)logs._124_4_ / 4;
                val_chk_5._0_4_ = (uint)val_chk_5 + 1) {
              iVar1 = snprintf((char *)((long)&j + (long)val_chk_5._4_4_),
                               0x7f - (long)val_chk_5._4_4_," %#08x",
                               (ulong)*(uint *)((long)val_01 + (long)(int)(uint)val_chk_5 * 4));
              val_chk_5._4_4_ = iVar1 + val_chk_5._4_4_;
            }
            _mpp_log_l(4,"kmpp_obj","%s\n",(char *)0x0,&j);
          }
          else {
            _mpp_log_l(2,"kmpp_obj","%-2d - %-16s st  get failed\n",(char *)0x0,(ulong)(uint)val_chk
                       ,_i);
          }
          kmpp_obj_get_st(caller_local,_i,val_00);
          iVar1 = memcmp(val_01,val_00,(ulong)*(ushort *)((long)_val + 2));
          if (iVar1 != 0) {
            _mpp_log_l(2,"kmpp_obj","%-2d - %-16s st  check failed\n",(char *)0x0,
                       (ulong)(uint)val_chk,_i);
            _mpp_log_l(2,"kmpp_obj","val     %p\n",(char *)0x0,val_01);
            _mpp_log_l(2,"kmpp_obj","val_chk %p\n",(char *)0x0,val_00);
          }
          if (val_01 != (void *)0x0) {
            mpp_osal_free("kmpp_obj_udump_f",val_01);
          }
          if (val_00 != (void *)0x0) {
            mpp_osal_free("kmpp_obj_udump_f",val_00);
          }
          break;
        case 6:
          e._0_4_ = uVar3;
          val_5 = (KmppShmPtr *)
                  mpp_osal_malloc("kmpp_obj_udump_f",(ulong)*(ushort *)((long)_val + 2));
          val_6 = mpp_osal_malloc("kmpp_obj_udump_f",(ulong)*(ushort *)((long)_val + 2));
          e._4_4_ = kmpp_obj_tbl_get_st(caller_local,_val,val_6);
          if (e._4_4_ == 0) {
            caller = *val_6;
            in_stack_fffffffffffffe40 = *(rk_u64 *)((long)val_6 + 8);
            _mpp_log_l(4,"kmpp_obj","%-2d - %-16s shm u%#llx:k%#llx\n",(char *)0x0,
                       (ulong)(uint)val_chk,_i,caller,in_stack_fffffffffffffe40);
          }
          else {
            _mpp_log_l(2,"kmpp_obj","%-2d - %-16s shm get failed\n",(char *)0x0,(ulong)(uint)val_chk
                       ,_i);
          }
          kmpp_obj_get_st(caller_local,_i,val_5);
          iVar1 = memcmp(val_6,val_5,(ulong)*(ushort *)((long)_val + 2));
          if (iVar1 != 0) {
            _mpp_log_l(2,"kmpp_obj","%-2d - %-16s shm check failed\n",(char *)0x0,
                       (ulong)(uint)val_chk,_i,caller);
            _mpp_log_l(2,"kmpp_obj","val     %p - %#llx:%#llx\n",(char *)0x0,val_6,*val_6,
                       *(undefined8 *)((long)val_6 + 8));
            caller = *(char **)&val_5->field_1;
            _mpp_log_l(2,"kmpp_obj","val_chk %p - %#llx:%#llx\n",(char *)0x0,val_5,
                       (val_5->field_0).uaddr);
          }
          if (val_6 != (void *)0x0) {
            mpp_osal_free("kmpp_obj_udump_f",val_6);
          }
          val_6 = (void *)0x0;
          if (val_5 != (KmppShmPtr *)0x0) {
            mpp_osal_free("kmpp_obj_udump_f",val_5);
          }
          val_5 = (KmppShmPtr *)0x0;
          break;
        case 0xd:
          e._0_4_ = uVar3;
          e._4_4_ = kmpp_obj_tbl_get_ptr(caller_local,_val,&val_chk_6);
          if (e._4_4_ == 0) {
            caller = (char *)val_chk_6;
            _mpp_log_l(4,"kmpp_obj","%-2d - %-16s ptr %p\n",(char *)0x0,(ulong)(uint)val_chk,_i,
                       val_chk_6);
          }
          else {
            _mpp_log_l(2,"kmpp_obj","%-2d - %-16s ptr get failed\n",(char *)0x0,(ulong)(uint)val_chk
                       ,_i);
          }
          kmpp_obj_get_ptr(caller_local,_i,&val_7);
          if (val_chk_6 != val_7) {
            _mpp_log_l(2,"kmpp_obj","%-2d - %-16s ptr check failed\n",(char *)0x0,
                       (ulong)(uint)val_chk,_i,caller);
          }
          break;
        case 0xe:
          e._0_4_ = uVar3;
          e._4_4_ = kmpp_obj_tbl_get_fp(caller_local,_val,&val_chk_7);
          if (e._4_4_ == 0) {
            caller = (char *)val_chk_7;
            _mpp_log_l(4,"kmpp_obj","%-2d - %-16s fp  %p\n",(char *)0x0,(ulong)(uint)val_chk,_i,
                       val_chk_7);
          }
          else {
            _mpp_log_l(2,"kmpp_obj","%-2d - %-16s fp  get failed\n",(char *)0x0,(ulong)(uint)val_chk
                       ,_i);
          }
          kmpp_obj_get_fp(caller_local,_i,&local_180);
          if (val_chk_7 != local_180) {
            _mpp_log_l(2,"kmpp_obj","%-2d - %-16s fp  check failed\n",(char *)0x0,
                       (ulong)(uint)val_chk,_i,caller);
          }
        }
      }
    }
    obj_local._4_4_ = 0;
    if (e._4_4_ != 0) {
      obj_local._4_4_ = -1;
    }
  }
  return obj_local._4_4_;
}

Assistant:

rk_s32 kmpp_obj_udump_f(KmppObj obj, const char *caller)
{
    KmppObjImpl *impl = (KmppObjImpl *)obj;
    KmppObjDefImpl *def = impl ? impl->def : NULL;
    MppTrie trie = NULL;
    MppTrieInfo *info = NULL;
    MppTrieInfo *next = NULL;
    const char *name = NULL;
    rk_s32 ret = rk_nok;
    RK_S32 i = 0;

    if (!impl || !def) {
        mpp_loge_f("invalid obj %p def %p\n", impl, def);
        return rk_nok;
    }

    trie = impl->trie;
    name = def->name;

    mpp_logi("dump obj %-12s - %p at %s:\n", name, impl, caller);

    next = mpp_trie_get_info_first(trie);
    while (next) {
        KmppEntry *e;
        rk_s32 idx;

        info = next;
        next = mpp_trie_get_info_next(trie, info);

        e = (KmppEntry *)mpp_trie_info_ctx(info);
        name = mpp_trie_info_name(info);

        if (strstr(name, "__"))
            continue;

        idx = i++;

        switch (e->tbl.elem_type) {
        case ELEM_TYPE_s32 : {
            rk_s32 val;
            rk_s32 val_chk;

            ret = kmpp_obj_tbl_get_s32(obj, e, &val);
            if (!ret)
                mpp_logi("%-2d - %-16s s32 %#x:%d\n", idx, name, val, val);
            else
                mpp_loge("%-2d - %-16s s32 get failed\n", idx, name);

            kmpp_obj_get_s32(obj, name, &val_chk);
            if (val != val_chk)
                mpp_loge("%-2d - %-16s s32 check failed\n", idx, name);
        } break;
        case ELEM_TYPE_u32 : {
            rk_u32 val;
            rk_u32 val_chk;

            ret = kmpp_obj_tbl_get_u32(obj, e, &val);
            if (!ret)
                mpp_logi("%-2d - %-16s u32 %#x:%u\n", idx, name, val, val);
            else
                mpp_loge("%-2d - %-16s u32 get failed\n", idx, name);

            kmpp_obj_get_u32(obj, name, &val_chk);
            if (val != val_chk)
                mpp_loge("%-2d - %-16s u32 check failed\n", idx, name);
        } break;
        case ELEM_TYPE_s64 : {
            rk_s64 val;
            rk_s64 val_chk;

            ret = kmpp_obj_tbl_get_s64(obj, e, &val);
            if (!ret)
                mpp_logi("%-2d - %-16s s64 %#llx:%lld\n", idx, name, val, val);
            else
                mpp_loge("%-2d - %-16s s64 get failed\n", idx, name);

            kmpp_obj_get_s64(obj, name, &val_chk);
            if (val != val_chk)
                mpp_loge("%-2d - %-16s s64 check failed\n", idx, name);
        } break;
        case ELEM_TYPE_u64 : {
            rk_u64 val;
            rk_u64 val_chk;

            ret = kmpp_obj_tbl_get_u64(obj, e, &val);
            if (!ret)
                mpp_logi("%-2d - %-16s u64 %#llx:%llu\n", idx, name, val, val);
            else
                mpp_loge("%-2d - %-16s u64 get failed\n", idx, name);

            kmpp_obj_get_u64(obj, name, &val_chk);
            if (val != val_chk)
                mpp_loge("%-2d - %-16s u64 check failed\n", idx, name);
        } break;
        case ELEM_TYPE_st : {
            void *val_chk = mpp_malloc_size(void, e->tbl.elem_size);
            void *val = mpp_malloc_size(void, e->tbl.elem_size);
            rk_s32 data_size = e->tbl.elem_size;
            char logs[128];

            ret = kmpp_obj_tbl_get_st(obj, e, val);
            if (!ret) {
                rk_s32 pos;
                rk_s32 j;

                mpp_logi("%-2d - %-16s st  %d:%d\n", idx, name, e->tbl.elem_offset, data_size);

                j = 0;
                for (; j < data_size / 4 - 8; j += 8) {
                    snprintf(logs, sizeof(logs) - 1, "   - %02x : %#08x %#08x %#08x %#08x %#08x %#08x %#08x %#08x", j,
                             ((RK_U32 *)val)[j + 0], ((RK_U32 *)val)[j + 1],
                             ((RK_U32 *)val)[j + 2], ((RK_U32 *)val)[j + 3],
                             ((RK_U32 *)val)[j + 4], ((RK_U32 *)val)[j + 5],
                             ((RK_U32 *)val)[j + 6], ((RK_U32 *)val)[j + 7]);

                    mpp_logi("%s\n", logs);
                }

                pos = snprintf(logs, sizeof(logs) - 1, "   - %02x :", j);
                for (; j < data_size / 4; j++)
                    pos += snprintf(logs + pos, sizeof(logs) - 1 - pos, " %#08x", ((RK_U32 *)val)[j]);

                mpp_logi("%s\n", logs);
            } else
                mpp_loge("%-2d - %-16s st  get failed\n", idx, name);

            kmpp_obj_get_st(obj, name, val_chk);
            if (memcmp(val, val_chk, e->tbl.elem_size)) {
                mpp_loge("%-2d - %-16s st  check failed\n", idx, name);
                mpp_loge("val     %p\n", val);
                mpp_loge("val_chk %p\n", val_chk);
            }

            MPP_FREE(val);
            MPP_FREE(val_chk);
        } break;
        case ELEM_TYPE_shm : {
            KmppShmPtr *val_chk = mpp_malloc_size(void, e->tbl.elem_size);
            KmppShmPtr *val = mpp_malloc_size(void, e->tbl.elem_size);

            ret = kmpp_obj_tbl_get_st(obj, e, val);
            if (!ret)
                mpp_logi("%-2d - %-16s shm u%#llx:k%#llx\n",
                         idx, name, val->uaddr, val->kaddr);
            else
                mpp_loge("%-2d - %-16s shm get failed\n", idx, name);

            kmpp_obj_get_st(obj, name, val_chk);
            if (memcmp(val, val_chk, e->tbl.elem_size)) {
                mpp_loge("%-2d - %-16s shm check failed\n", idx, name);
                mpp_loge("val     %p - %#llx:%#llx\n", val, val->uaddr, val->kaddr);
                mpp_loge("val_chk %p - %#llx:%#llx\n", val_chk, val_chk->uaddr, val_chk->kaddr);
            }

            MPP_FREE(val);
            MPP_FREE(val_chk);
        } break;
        case ELEM_TYPE_uptr : {
            void *val;
            void *val_chk;

            ret = kmpp_obj_tbl_get_ptr(obj, e, &val);
            if (!ret)
                mpp_logi("%-2d - %-16s ptr %p\n", idx, name, val);
            else
                mpp_loge("%-2d - %-16s ptr get failed\n", idx, name);

            kmpp_obj_get_ptr(obj, name, &val_chk);
            if (val != val_chk)
                mpp_loge("%-2d - %-16s ptr check failed\n", idx, name);
        } break;
        case ELEM_TYPE_ufp : {
            void *val;
            void *val_chk;

            ret = kmpp_obj_tbl_get_fp(obj, e, &val);
            if (!ret)
                mpp_logi("%-2d - %-16s fp  %p\n", idx, name, val);
            else
                mpp_loge("%-2d - %-16s fp  get failed\n", idx, name);

            kmpp_obj_get_fp(obj, name, &val_chk);
            if (val != val_chk)
                mpp_loge("%-2d - %-16s fp  check failed\n", idx, name);
        } break;
        default : {
            mpp_loge("%-2d - %-16s found invalid type %d\n", idx, name, e->tbl.elem_type);
            ret = rk_nok;
        } break;
        }
    }

    return ret ? rk_nok : rk_ok;
}